

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O0

void Rml::Parse::StringLiteral(DataParser *parser)

{
  undefined8 this;
  bool local_73;
  Variant local_70;
  char local_45;
  char c_prev;
  char local_31;
  undefined1 local_30 [7];
  char c;
  String str;
  DataParser *parser_local;
  
  str.field_2._8_8_ = parser;
  ::std::__cxx11::string::string((string *)local_30);
  local_31 = DataParser::Look((DataParser *)str.field_2._8_8_);
  local_45 = '\0';
  while( true ) {
    this = str.field_2._8_8_;
    local_73 = false;
    if (local_31 != '\0') {
      local_73 = local_31 != '\'' || local_45 == '\\';
    }
    if (!local_73) break;
    if ((local_45 == '\\') && ((local_31 == '\\' || (local_31 == '\'')))) {
      ::std::__cxx11::string::pop_back();
      local_45 = '\0';
    }
    else {
      local_45 = local_31;
    }
    ::std::__cxx11::string::operator+=((string *)local_30,local_31);
    local_31 = DataParser::Next((DataParser *)str.field_2._8_8_);
  }
  Variant::Variant<std::__cxx11::string&,void>
            (&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30
            );
  DataParser::Emit((DataParser *)this,Literal,&local_70);
  Variant::~Variant(&local_70);
  ::std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

static void StringLiteral(DataParser& parser)
	{
		String str;

		char c = parser.Look();
		char c_prev = '\0';

		while (c != '\0' && (c != '\'' || c_prev == '\\'))
		{
			if (c_prev == '\\' && (c == '\\' || c == '\''))
			{
				str.pop_back();
				c_prev = '\0';
			}
			else
			{
				c_prev = c;
			}

			str += c;
			c = parser.Next();
		}

		parser.Emit(Instruction::Literal, Variant(str));
	}